

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block.c
# Opt level: O1

void cdef_filter_block_internal
               (uint8_t *dst8,uint16_t *dst16,int dstride,uint16_t *in,int pri_strength,
               int sec_strength,int dir,int pri_damping,int sec_damping,int coeff_shift,
               int block_width,int block_height,int enable_primary,int enable_secondary)

{
  long lVar1;
  uint16_t *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint16_t uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  byte bVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  bool bVar25;
  bool bVar26;
  ulong local_a8;
  
  bVar25 = enable_primary != 0;
  bVar26 = enable_secondary != 0;
  if (0 < block_height) {
    iVar19 = 0x1f;
    if (pri_strength != 0) {
      for (; (uint)pri_strength >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    bVar18 = (char)pri_damping - (char)iVar19;
    if (pri_damping < iVar19) {
      bVar18 = 0;
    }
    iVar19 = 0x1f;
    if (sec_strength != 0) {
      for (; (uint)sec_strength >> iVar19 == 0; iVar19 = iVar19 + -1) {
      }
    }
    bVar17 = (char)sec_damping - (char)iVar19;
    local_a8 = 0;
    if (sec_damping < iVar19) {
      bVar17 = 0;
    }
    lVar1 = (long)dir * 8;
    do {
      if (0 < block_width) {
        uVar10 = 0;
        do {
          lVar9 = uVar10 + local_a8 * 0x90;
          puVar2 = in + lVar9;
          iVar13 = (int)(short)*puVar2;
          lVar14 = 0;
          iVar24 = 0;
          iVar19 = iVar13;
          iVar3 = iVar13;
          do {
            if (enable_primary != 0) {
              lVar16 = (long)*(int *)(lVar1 + 0x51b000 + lVar14 * 4);
              iVar11 = (int)(short)puVar2[lVar16];
              uVar21 = 0;
              if (pri_strength != 0) {
                uVar20 = iVar11 - iVar13;
                uVar21 = -uVar20;
                if (0 < (int)uVar20) {
                  uVar21 = uVar20;
                }
                uVar4 = pri_strength - (uVar21 >> (bVar18 & 0x1f));
                if ((int)uVar4 < 1) {
                  uVar4 = 0;
                }
                if (uVar21 < uVar4) {
                  uVar4 = uVar21;
                }
                uVar21 = -uVar4;
                if (-1 < (int)uVar20) {
                  uVar21 = uVar4;
                }
              }
              iVar15 = (int)(short)in[lVar9 - lVar16];
              uVar20 = 0;
              if (pri_strength != 0) {
                uVar4 = iVar15 - iVar13;
                uVar20 = -uVar4;
                if (0 < (int)uVar4) {
                  uVar20 = uVar4;
                }
                uVar5 = pri_strength - (uVar20 >> (bVar18 & 0x1f));
                if ((int)uVar5 < 1) {
                  uVar5 = 0;
                }
                if (uVar20 < uVar5) {
                  uVar5 = uVar20;
                }
                uVar20 = -uVar5;
                if (-1 < (int)uVar4) {
                  uVar20 = uVar5;
                }
              }
              iVar24 = iVar24 + uVar21 * cdef_pri_taps
                                         [((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0]
                                         [lVar14] +
                       uVar20 * cdef_pri_taps
                                [((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0][lVar14];
              if (bVar25 && bVar26) {
                iVar22 = iVar19;
                if (iVar19 <= iVar11) {
                  iVar22 = iVar11;
                }
                if (iVar11 == 0x4000) {
                  iVar22 = iVar19;
                }
                iVar19 = iVar22;
                if (iVar22 <= iVar15) {
                  iVar19 = iVar15;
                }
                if (iVar15 == 0x4000) {
                  iVar19 = iVar22;
                }
                if (iVar11 <= iVar3) {
                  iVar3 = iVar11;
                }
                if (iVar15 <= iVar3) {
                  iVar3 = iVar15;
                }
              }
            }
            if (enable_secondary != 0) {
              lVar16 = (long)*(int *)(lVar1 + 0x51b010 + lVar14 * 4);
              iVar23 = (int)(short)puVar2[lVar16];
              iVar22 = (int)(short)in[lVar9 - lVar16];
              iVar11 = (int)(short)puVar2[cdef_directions_padded[dir][lVar14]];
              iVar15 = (int)(short)in[lVar9 - cdef_directions_padded[dir][lVar14]];
              if (bVar25 && bVar26) {
                iVar6 = iVar19;
                if (iVar19 <= iVar23) {
                  iVar6 = iVar23;
                }
                if (iVar23 == 0x4000) {
                  iVar6 = iVar19;
                }
                iVar19 = iVar6;
                if (iVar6 <= iVar22) {
                  iVar19 = iVar22;
                }
                if (iVar22 == 0x4000) {
                  iVar19 = iVar6;
                }
                iVar6 = iVar19;
                if (iVar19 <= iVar11) {
                  iVar6 = iVar11;
                }
                if (iVar11 == 0x4000) {
                  iVar6 = iVar19;
                }
                iVar19 = iVar6;
                if (iVar6 <= iVar15) {
                  iVar19 = iVar15;
                }
                if (iVar15 == 0x4000) {
                  iVar19 = iVar6;
                }
                if (iVar23 <= iVar3) {
                  iVar3 = iVar23;
                }
                if (iVar22 <= iVar3) {
                  iVar3 = iVar22;
                }
                if (iVar11 <= iVar3) {
                  iVar3 = iVar11;
                }
                if (iVar15 <= iVar3) {
                  iVar3 = iVar15;
                }
              }
              iVar6 = cdef_sec_taps[lVar14];
              uVar21 = 0;
              if (sec_strength != 0) {
                uVar20 = iVar23 - iVar13;
                uVar21 = -uVar20;
                if (0 < (int)uVar20) {
                  uVar21 = uVar20;
                }
                uVar4 = sec_strength - (uVar21 >> (bVar17 & 0x1f));
                if ((int)uVar4 < 1) {
                  uVar4 = 0;
                }
                if (uVar21 < uVar4) {
                  uVar4 = uVar21;
                }
                uVar21 = -uVar4;
                if (-1 < (int)uVar20) {
                  uVar21 = uVar4;
                }
              }
              uVar20 = 0;
              if (sec_strength != 0) {
                uVar4 = iVar22 - iVar13;
                uVar20 = -uVar4;
                if (0 < (int)uVar4) {
                  uVar20 = uVar4;
                }
                uVar5 = sec_strength - (uVar20 >> (bVar17 & 0x1f));
                if ((int)uVar5 < 1) {
                  uVar5 = 0;
                }
                if (uVar20 < uVar5) {
                  uVar5 = uVar20;
                }
                uVar20 = -uVar5;
                if (-1 < (int)uVar4) {
                  uVar20 = uVar5;
                }
              }
              uVar4 = 0;
              if (sec_strength != 0) {
                uVar5 = iVar11 - iVar13;
                uVar4 = -uVar5;
                if (0 < (int)uVar5) {
                  uVar4 = uVar5;
                }
                uVar7 = sec_strength - (uVar4 >> (bVar17 & 0x1f));
                if ((int)uVar7 < 1) {
                  uVar7 = 0;
                }
                if (uVar4 < uVar7) {
                  uVar7 = uVar4;
                }
                uVar4 = -uVar7;
                if (-1 < (int)uVar5) {
                  uVar4 = uVar7;
                }
              }
              uVar5 = 0;
              if (sec_strength != 0) {
                uVar7 = iVar15 - iVar13;
                uVar5 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar5 = uVar7;
                }
                uVar8 = sec_strength - (uVar5 >> (bVar17 & 0x1f));
                if ((int)uVar8 < 1) {
                  uVar8 = 0;
                }
                if (uVar5 < uVar8) {
                  uVar8 = uVar5;
                }
                uVar5 = -uVar8;
                if (-1 < (int)uVar7) {
                  uVar5 = uVar8;
                }
              }
              iVar24 = iVar24 + uVar21 * iVar6 + uVar20 * iVar6 + uVar4 * iVar6 + uVar5 * iVar6;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 == 1);
          uVar12 = *puVar2 + (short)((int)(short)iVar24 + ((int)(short)iVar24 >> 0xf) + 8U >> 4);
          if (bVar25 && bVar26) {
            iVar13 = (int)(short)uVar12;
            if (iVar13 < iVar19) {
              iVar19 = iVar13;
            }
            if (iVar13 < iVar3) {
              iVar19 = iVar3;
            }
            uVar12 = (uint16_t)iVar19;
          }
          if (dst8 == (uint8_t *)0x0) {
            dst16[local_a8 * (long)dstride + uVar10] = uVar12;
          }
          else {
            dst8[uVar10 + local_a8 * (long)dstride] = (uint8_t)uVar12;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)block_width);
      }
      local_a8 = local_a8 + 1;
    } while (local_a8 != (uint)block_height);
  }
  return;
}

Assistant:

static void cdef_filter_block_internal(
    uint8_t *dst8, uint16_t *dst16, int dstride, const uint16_t *in,
    int pri_strength, int sec_strength, int dir, int pri_damping,
    int sec_damping, int coeff_shift, int block_width, int block_height,
    int enable_primary, int enable_secondary) {
  const int clipping_required = (enable_primary && enable_secondary);
  int i, j, k;
  const int s = CDEF_BSTRIDE;
  const int *pri_taps = cdef_pri_taps[(pri_strength >> coeff_shift) & 1];
  const int *sec_taps = cdef_sec_taps;
  for (i = 0; i < block_height; i++) {
    for (j = 0; j < block_width; j++) {
      int16_t sum = 0;
      int16_t y;
      int16_t x = in[i * s + j];
      int max = x;
      int min = x;
      for (k = 0; k < 2; k++) {
        if (enable_primary) {
          int16_t p0 = in[i * s + j + cdef_directions[dir][k]];
          int16_t p1 = in[i * s + j - cdef_directions[dir][k]];
          sum += pri_taps[k] * constrain(p0 - x, pri_strength, pri_damping);
          sum += pri_taps[k] * constrain(p1 - x, pri_strength, pri_damping);
          if (clipping_required) {
            if (p0 != CDEF_VERY_LARGE) max = AOMMAX(p0, max);
            if (p1 != CDEF_VERY_LARGE) max = AOMMAX(p1, max);
            min = AOMMIN(p0, min);
            min = AOMMIN(p1, min);
          }
        }
        if (enable_secondary) {
          int16_t s0 = in[i * s + j + cdef_directions[dir + 2][k]];
          int16_t s1 = in[i * s + j - cdef_directions[dir + 2][k]];
          int16_t s2 = in[i * s + j + cdef_directions[dir - 2][k]];
          int16_t s3 = in[i * s + j - cdef_directions[dir - 2][k]];
          if (clipping_required) {
            if (s0 != CDEF_VERY_LARGE) max = AOMMAX(s0, max);
            if (s1 != CDEF_VERY_LARGE) max = AOMMAX(s1, max);
            if (s2 != CDEF_VERY_LARGE) max = AOMMAX(s2, max);
            if (s3 != CDEF_VERY_LARGE) max = AOMMAX(s3, max);
            min = AOMMIN(s0, min);
            min = AOMMIN(s1, min);
            min = AOMMIN(s2, min);
            min = AOMMIN(s3, min);
          }
          sum += sec_taps[k] * constrain(s0 - x, sec_strength, sec_damping);
          sum += sec_taps[k] * constrain(s1 - x, sec_strength, sec_damping);
          sum += sec_taps[k] * constrain(s2 - x, sec_strength, sec_damping);
          sum += sec_taps[k] * constrain(s3 - x, sec_strength, sec_damping);
        }
      }
      y = ((int16_t)x + ((8 + sum - (sum < 0)) >> 4));
      if (clipping_required) {
        y = clamp(y, min, max);
      }

      if (dst8)
        dst8[i * dstride + j] = (uint8_t)y;
      else
        dst16[i * dstride + j] = (uint16_t)y;
    }
  }
}